

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowValueLocalState::WindowValueLocalState
          (WindowValueLocalState *this,WindowValueGlobalState *gvstate)

{
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> _Var2;
  pointer pWVar3;
  pointer *__ptr;
  pointer *__ptr_1;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_30;
  
  WindowExecutorBoundsState::WindowExecutorBoundsState
            (&this->super_WindowExecutorBoundsState,&gvstate->super_WindowExecutorGlobalState);
  (this->super_WindowExecutorBoundsState).super_WindowExecutorLocalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowValueLocalState_0199c5e0;
  this->gvstate = gvstate;
  (this->local_value).
  super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl =
       (WindowAggregatorState *)0x0;
  (this->sort_nulls).sel_vector = (sel_t *)0x0;
  (this->sort_nulls).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->sort_nulls).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cursor).super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
  _M_t.super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  WindowAggregatorLocalState::InitSubFrames
            (&this->frames,
             ((gvstate->super_WindowExecutorGlobalState).executor)->wexpr->exclude_clause);
  if ((gvstate->value_tree).
      super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
      super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
      .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl !=
      (WindowIndexTree *)0x0) {
    pWVar3 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&gvstate->value_tree);
    (*(pWVar3->super_WindowMergeSortTree)._vptr_WindowMergeSortTree[2])(&local_30,pWVar3);
    _Var2._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (WindowAggregatorState *)0x0;
    _Var1._M_head_impl =
         (this->local_value).
         super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
         .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl;
    (this->local_value).
    super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
    .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl = _Var2._M_head_impl
    ;
    if (_Var1._M_head_impl != (WindowAggregatorState *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_WindowAggregatorState + 8))();
      if (local_30._M_head_impl != (WindowAggregatorState *)0x0) {
        (*(local_30._M_head_impl)->_vptr_WindowAggregatorState[1])();
      }
    }
    if (((gvstate->super_WindowExecutorGlobalState).executor)->wexpr->ignore_nulls == true) {
      SelectionVector::Initialize(&this->sort_nulls,0x800);
    }
  }
  return;
}

Assistant:

explicit WindowValueLocalState(const WindowValueGlobalState &gvstate)
	    : WindowExecutorBoundsState(gvstate), gvstate(gvstate) {
		WindowAggregatorLocalState::InitSubFrames(frames, gvstate.executor.wexpr.exclude_clause);

		if (gvstate.value_tree) {
			local_value = gvstate.value_tree->GetLocalState();
			if (gvstate.executor.wexpr.ignore_nulls) {
				sort_nulls.Initialize();
			}
		}
	}